

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_294a56::ParseDataSink::put
          (ParseDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  UErrorCode UVar1;
  UBool UVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  undefined4 uVar7;
  undefined7 in_register_00000009;
  Key key_00;
  int32_t len;
  UnicodeString str;
  ResourceArray array;
  ResourceTable contextsTable;
  ResourceTable strictnessTable;
  char *local_110;
  int32_t local_104;
  ConstChar16Ptr local_100;
  int local_f4;
  int local_f0;
  Key local_ec;
  UnicodeString local_e8;
  char16_t *local_a8;
  ResourceArray local_98;
  ResourceTable local_80;
  ResourceTable local_58;
  
  local_110 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_80,value,status,CONCAT71(in_register_00000009,param_3));
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = 0;
    UVar2 = icu_63::ResourceTable::getKeyAndValue(&local_80,0,&local_110,value);
    if (UVar2 != '\0') {
      do {
        iVar3 = strcmp(local_110,"date");
        if (iVar3 != 0) {
          (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,status);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          local_f4 = iVar4;
          UVar2 = icu_63::ResourceTable::getKeyAndValue(&local_58,0,&local_110,value);
          iVar4 = local_f4;
          if (UVar2 != '\0') {
            iVar3 = 0;
            do {
              local_f0 = iVar3;
              iVar4 = strcmp(local_110,"lenient");
              (*(value->super_UObject)._vptr_UObject[10])(&local_98,value,status);
              if (U_ZERO_ERROR < *status) {
                return;
              }
              if (0 < local_98.length) {
                local_ec = (uint)(iVar4 != 0) * 2 + COMMA;
                iVar3 = 0;
                do {
                  icu_63::ResourceArray::getValue(&local_98,iVar3,value);
                  local_104 = 0;
                  iVar5 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_104,status);
                  local_100.p_ = (char16_t *)CONCAT44(extraout_var,iVar5);
                  icu_63::UnicodeString::UnicodeString(&local_e8,'\x01',&local_100,local_104);
                  local_a8 = local_100.p_;
                  if (U_ZERO_ERROR < *status) {
                    icu_63::UnicodeString::~UnicodeString(&local_e8);
                    return;
                  }
                  uVar7 = local_e8.fUnion.fFields.fLength;
                  if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'.',0,uVar7);
                  key_00 = (uint)(iVar4 != 0) * 2 + PERIOD;
                  if (iVar6 == -1) {
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L',',0,uVar7);
                    key_00 = local_ec;
                    if (iVar6 != -1) goto LAB_002a819a;
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'+',0,uVar7);
                    key_00 = PLUS_SIGN;
                    if (iVar6 != -1) goto LAB_002a819a;
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'‒',0,uVar7);
                    key_00 = MINUS_SIGN;
                    if (iVar6 != -1) goto LAB_002a819a;
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'$',0,uVar7);
                    key_00 = DOLLAR_SIGN;
                    if (iVar6 != -1) goto LAB_002a819a;
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'£',0,uVar7);
                    key_00 = POUND_SIGN;
                    if (iVar6 != -1) goto LAB_002a819a;
                    uVar7 = local_e8.fUnion.fFields.fLength;
                    if (-1 < local_e8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar7 = (int)local_e8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    iVar6 = icu_63::UnicodeString::doIndexOf(&local_e8,L'₨',0,uVar7);
                    key_00 = RUPEE_SIGN;
                    if (iVar6 != -1) goto LAB_002a819a;
                  }
                  else {
LAB_002a819a:
                    saveSet(key_00,&local_e8,status);
                  }
                  UVar1 = *status;
                  icu_63::UnicodeString::~UnicodeString(&local_e8);
                  if (U_ZERO_ERROR < UVar1) {
                    return;
                  }
                  iVar3 = iVar3 + 1;
                } while (iVar3 < local_98.length);
              }
              iVar3 = local_f0 + 1;
              UVar2 = icu_63::ResourceTable::getKeyAndValue(&local_58,iVar3,&local_110,value);
              iVar4 = local_f4;
            } while (UVar2 != '\0');
          }
        }
        iVar4 = iVar4 + 1;
        UVar2 = icu_63::ResourceTable::getKeyAndValue(&local_80,iVar4,&local_110,value);
      } while (UVar2 != '\0');
    }
  }
  return;
}

Assistant:

void put(const char* key, ResourceValue& value, UBool /*noFallback*/, UErrorCode& status) U_OVERRIDE {
        ResourceTable contextsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i = 0; contextsTable.getKeyAndValue(i, key, value); i++) {
            if (uprv_strcmp(key, "date") == 0) {
                // ignore
            } else {
                ResourceTable strictnessTable = value.getTable(status);
                if (U_FAILURE(status)) { return; }
                for (int j = 0; strictnessTable.getKeyAndValue(j, key, value); j++) {
                    bool isLenient = (uprv_strcmp(key, "lenient") == 0);
                    ResourceArray array = value.getArray(status);
                    if (U_FAILURE(status)) { return; }
                    for (int k = 0; k < array.getSize(); k++) {
                        array.getValue(k, value);
                        UnicodeString str = value.getUnicodeString(status);
                        if (U_FAILURE(status)) { return; }
                        // There is both lenient and strict data for comma/period,
                        // but not for any of the other symbols.
                        if (str.indexOf(u'.') != -1) {
                            saveSet(isLenient ? PERIOD : STRICT_PERIOD, str, status);
                        } else if (str.indexOf(u',') != -1) {
                            saveSet(isLenient ? COMMA : STRICT_COMMA, str, status);
                        } else if (str.indexOf(u'+') != -1) {
                            saveSet(PLUS_SIGN, str, status);
                        } else if (str.indexOf(u'‒') != -1) {
                            saveSet(MINUS_SIGN, str, status);
                        } else if (str.indexOf(u'$') != -1) {
                            saveSet(DOLLAR_SIGN, str, status);
                        } else if (str.indexOf(u'£') != -1) {
                            saveSet(POUND_SIGN, str, status);
                        } else if (str.indexOf(u'₨') != -1) {
                            saveSet(RUPEE_SIGN, str, status);
                        }
                        if (U_FAILURE(status)) { return; }
                    }
                }
            }
        }
    }